

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

bool __thiscall libcellml::XmlNode::isBasicReal(XmlNode *this)

{
  bool bVar1;
  string local_30;
  XmlNode *local_10;
  XmlNode *this_local;
  
  local_10 = this;
  convertToStrippedString_abi_cxx11_(&local_30,this);
  bVar1 = canConvertToBasicDouble(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool XmlNode::isBasicReal() const
{
    return canConvertToBasicDouble(convertToStrippedString());
}